

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_cache_test.cc
# Opt level: O0

void TemplateCacheUnittest::TestTemplateString(void)

{
  byte bVar1;
  TemplateString local_370;
  TemplateString local_350;
  TemplateString local_330;
  TemplateString local_310;
  TemplateString local_2f0;
  TemplateString local_2d0;
  TemplateString local_2b0;
  TemplateString local_290;
  TemplateString local_270;
  allocator local_249;
  string local_248 [39];
  allocator local_221;
  string local_220 [32];
  TemplateString local_200;
  allocator local_1d9;
  string local_1d8 [39];
  allocator local_1b1;
  string local_1b0 [32];
  TemplateString local_190;
  TemplateDictionary local_170 [8];
  TemplateDictionary dict;
  TemplateString local_100;
  long local_e0;
  Template *tpl;
  TemplateString local_b8;
  TemplateString local_98;
  TemplateString local_68;
  undefined1 local_48 [8];
  TemplateCache cache;
  
  ctemplate::TemplateCache::TemplateCache((TemplateCache *)local_48);
  ctemplate::TemplateString::TemplateString(&local_68,&kKey);
  ctemplate::TemplateString::TemplateString(&local_98,&kContent);
  bVar1 = ctemplate::TemplateCache::StringToTemplateCache
                    ((TemplateString *)local_48,&local_68,(Strip)&local_98);
  if (((bVar1 ^ 0xff) & 1) != 0) {
    printf("ASSERT FAILED, line %d: %s\n",0x3b3,
           "cache.StringToTemplateCache(kKey, kContent, DO_NOT_STRIP)");
    ctemplate::TemplateString::TemplateString(&local_b8,&kKey);
    ctemplate::TemplateString::TemplateString((TemplateString *)&tpl,&kContent);
    bVar1 = ctemplate::TemplateCache::StringToTemplateCache
                      ((TemplateString *)local_48,&local_b8,(Strip)&tpl);
    if ((bVar1 & 1) == 0) {
      __assert_fail("cache.StringToTemplateCache(kKey, kContent, DO_NOT_STRIP)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_cache_test.cc"
                    ,0x3b3,"static void TemplateCacheUnittest::TestTemplateString()");
    }
    exit(1);
  }
  ctemplate::TemplateString::TemplateString(&local_100,&kKey);
  local_e0 = ctemplate::TemplateCache::GetTemplate((TemplateString *)local_48,(Strip)&local_100);
  if (local_e0 == 0) {
    printf("ASSERT FAILED, line %d: %s\n",0x3b5,"tpl");
    if (local_e0 != 0) {
      exit(1);
    }
    __assert_fail("tpl",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_cache_test.cc"
                  ,0x3b5,"static void TemplateCacheUnittest::TestTemplateString()");
  }
  ctemplate::TemplateString::TemplateString(&local_190,"dict");
  ctemplate::TemplateDictionary::TemplateDictionary(local_170,&local_190,(UnsafeArena *)0x0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1b0,"MY_KEY",&local_1b1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1d8,"content",&local_1d9);
  ctemplate::AssertExpandWithCacheIs
            ((TemplateCache *)local_48,(string *)local_1b0,DO_NOT_STRIP,local_170,
             (PerExpandData *)0x0,(string *)local_1d8,true);
  std::__cxx11::string::~string(local_1d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1d9);
  std::__cxx11::string::~string(local_1b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1b1);
  ctemplate::TemplateString::TemplateString(&local_200,"MY_KEY");
  local_e0 = ctemplate::TemplateCache::GetTemplate((TemplateString *)local_48,(Strip)&local_200);
  if (local_e0 == 0) {
    printf("ASSERT FAILED, line %d: %s\n",0x3bd,"tpl");
    if (local_e0 != 0) {
      exit(1);
    }
    __assert_fail("tpl",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_cache_test.cc"
                  ,0x3bd,"static void TemplateCacheUnittest::TestTemplateString()");
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_220,"MY_KEY",&local_221);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_248,"content",&local_249);
  ctemplate::AssertExpandWithCacheIs
            ((TemplateCache *)local_48,(string *)local_220,DO_NOT_STRIP,local_170,
             (PerExpandData *)0x0,(string *)local_248,true);
  std::__cxx11::string::~string(local_248);
  std::allocator<char>::~allocator((allocator<char> *)&local_249);
  std::__cxx11::string::~string(local_220);
  std::allocator<char>::~allocator((allocator<char> *)&local_221);
  ctemplate::TemplateString::TemplateString(&local_270,"MY_KEY");
  ctemplate::TemplateCache::Delete((TemplateString *)local_48);
  ctemplate::TemplateString::TemplateString(&local_290,"MY_KEY");
  local_e0 = ctemplate::TemplateCache::GetTemplate((TemplateString *)local_48,(Strip)&local_290);
  if (local_e0 != 0) {
    printf("ASSERT FAILED, line %d: %s\n",0x3c4,"!tpl");
    if (local_e0 != 0) {
      __assert_fail("!tpl",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_cache_test.cc"
                    ,0x3c4,"static void TemplateCacheUnittest::TestTemplateString()");
    }
    exit(1);
  }
  ctemplate::TemplateString::TemplateString(&local_2b0,"MY_KEY");
  ctemplate::TemplateString::TemplateString(&local_2d0,"content");
  bVar1 = ctemplate::TemplateCache::StringToTemplateCache
                    ((TemplateString *)local_48,&local_2b0,(Strip)&local_2d0);
  if (((bVar1 ^ 0xff) & 1) != 0) {
    printf("ASSERT FAILED, line %d: %s\n",0x3c6,
           "cache.StringToTemplateCache(\"MY_KEY\", \"content\", DO_NOT_STRIP)");
    ctemplate::TemplateString::TemplateString(&local_2f0,"MY_KEY");
    ctemplate::TemplateString::TemplateString(&local_310,"content");
    bVar1 = ctemplate::TemplateCache::StringToTemplateCache
                      ((TemplateString *)local_48,&local_2f0,(Strip)&local_310);
    if ((bVar1 & 1) == 0) {
      __assert_fail("cache.StringToTemplateCache(\"MY_KEY\", \"content\", DO_NOT_STRIP)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_cache_test.cc"
                    ,0x3c6,"static void TemplateCacheUnittest::TestTemplateString()");
    }
    exit(1);
  }
  ctemplate::TemplateString::TemplateString(&local_330,&kKey);
  local_e0 = ctemplate::TemplateCache::GetTemplate((TemplateString *)local_48,(Strip)&local_330);
  if (local_e0 == 0) {
    printf("ASSERT FAILED, line %d: %s\n",0x3c8,"tpl");
    if (local_e0 != 0) {
      exit(1);
    }
    __assert_fail("tpl",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_cache_test.cc"
                  ,0x3c8,"static void TemplateCacheUnittest::TestTemplateString()");
  }
  ctemplate::TemplateString::TemplateString(&local_350,&kKey);
  ctemplate::TemplateCache::Delete((TemplateString *)local_48);
  ctemplate::TemplateString::TemplateString(&local_370,"MY_KEY");
  local_e0 = ctemplate::TemplateCache::GetTemplate((TemplateString *)local_48,(Strip)&local_370);
  if (local_e0 == 0) {
    ctemplate::TemplateDictionary::~TemplateDictionary(local_170);
    ctemplate::TemplateCache::~TemplateCache((TemplateCache *)local_48);
    return;
  }
  printf("ASSERT FAILED, line %d: %s\n",0x3cb,"!tpl");
  if (local_e0 != 0) {
    __assert_fail("!tpl",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_cache_test.cc"
                  ,0x3cb,"static void TemplateCacheUnittest::TestTemplateString()");
  }
  exit(1);
}

Assistant:

static void TestTemplateString() {
    TemplateCache cache;
    ASSERT(cache.StringToTemplateCache(kKey, kContent, DO_NOT_STRIP));
    const Template *tpl = cache.GetTemplate(kKey, DO_NOT_STRIP);
    ASSERT(tpl);

    TemplateDictionary dict("dict");
    AssertExpandWithCacheIs(&cache, "MY_KEY", DO_NOT_STRIP, &dict, NULL,
                            "content", true);

    // Try retrieving with a char* rather than a TemplateString*.
    tpl = cache.GetTemplate("MY_KEY", DO_NOT_STRIP);
    ASSERT(tpl);
    AssertExpandWithCacheIs(&cache, "MY_KEY", DO_NOT_STRIP, &dict, NULL,
                            "content", true);

    // Delete with a char* rather than a TemplateString*.
    cache.Delete("MY_KEY");
    tpl = cache.GetTemplate("MY_KEY", DO_NOT_STRIP);
    ASSERT(!tpl);

    ASSERT(cache.StringToTemplateCache("MY_KEY", "content", DO_NOT_STRIP));
    tpl = cache.GetTemplate(kKey, DO_NOT_STRIP);
    ASSERT(tpl);
    cache.Delete(kKey);
    tpl = cache.GetTemplate("MY_KEY", DO_NOT_STRIP);
    ASSERT(!tpl);
  }